

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int updateMapping(Rtree *pRtree,i64 iRowid,RtreeNode *pNode,int iHeight)

{
  int iVar1;
  RtreeNode *pRVar2;
  code *UNRECOVERED_JUMPTABLE;
  RtreeNode *pRVar3;
  bool bVar4;
  
  UNRECOVERED_JUMPTABLE = parentWrite;
  if (iHeight == 0) {
    UNRECOVERED_JUMPTABLE = rowidWrite;
  }
  if (0 < iHeight) {
    iVar1 = (int)((iRowid & 0xffffffffU) * 0x51d07eaf >> 0x20);
    for (pRVar3 = pRtree->aHash
                  [(int)iRowid + (((uint)((int)iRowid - iVar1) >> 1) + iVar1 >> 6) * -0x61];
        (pRVar3 != (RtreeNode *)0x0 && (pRVar3->iNode != iRowid)); pRVar3 = pRVar3->pNext) {
    }
    bVar4 = pNode == (RtreeNode *)0x0;
    if (bVar4) {
LAB_001fd489:
      if (pRVar3 != (RtreeNode *)0x0) {
        nodeRelease(pRtree,pRVar3->pParent);
        if (pNode != (RtreeNode *)0x0) {
          pNode->nRef = pNode->nRef + 1;
        }
        pRVar3->pParent = pNode;
      }
    }
    else {
      pRVar2 = pNode;
      if (pRVar3 != pNode) {
        do {
          pRVar2 = pRVar2->pParent;
          bVar4 = pRVar2 == (RtreeNode *)0x0;
          if (bVar4) goto LAB_001fd489;
        } while (pRVar2 != pRVar3);
      }
    }
    if (!bVar4) {
      return 0x10b;
    }
  }
  iVar1 = (*UNRECOVERED_JUMPTABLE)(pRtree,iRowid,pNode->iNode);
  return iVar1;
}

Assistant:

static int updateMapping(
  Rtree *pRtree,
  i64 iRowid,
  RtreeNode *pNode,
  int iHeight
){
  int (*xSetMapping)(Rtree *, sqlite3_int64, sqlite3_int64);
  xSetMapping = ((iHeight==0)?rowidWrite:parentWrite);
  if( iHeight>0 ){
    RtreeNode *pChild = nodeHashLookup(pRtree, iRowid);
    RtreeNode *p;
    for(p=pNode; p; p=p->pParent){
      if( p==pChild ) return SQLITE_CORRUPT_VTAB;
    }
    if( pChild ){
      nodeRelease(pRtree, pChild->pParent);
      nodeReference(pNode);
      pChild->pParent = pNode;
    }
  }
  if( NEVER(pNode==0) ) return SQLITE_ERROR;
  return xSetMapping(pRtree, iRowid, pNode->iNode);
}